

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersector1<8,_1048576,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  Geometry *this;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  bool bVar39;
  byte bVar40;
  bool bVar41;
  int iVar42;
  ulong *puVar43;
  ulong uVar44;
  long lVar45;
  ulong *puVar46;
  byte bVar47;
  size_t i;
  long lVar48;
  long lVar49;
  ulong uVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  undefined1 auVar53 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  local_2370[0] = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar81 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar6 = (context->query_radius).field_0;
    auVar80 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar81 = ZEXT1664(auVar80);
  }
  puVar46 = local_2368;
  fVar2 = *(float *)&(query->p).field_0;
  fVar3 = *(float *)((long)&(query->p).field_0 + 4);
  fVar4 = *(float *)((long)&(query->p).field_0 + 8);
  uVar5 = *(undefined4 *)&(context->query_radius).field_0;
  auVar60._4_4_ = uVar5;
  auVar60._0_4_ = uVar5;
  auVar60._8_4_ = uVar5;
  auVar60._12_4_ = uVar5;
  auVar60._16_4_ = uVar5;
  auVar60._20_4_ = uVar5;
  auVar60._24_4_ = uVar5;
  auVar60._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar65._4_4_ = uVar5;
  auVar65._0_4_ = uVar5;
  auVar65._8_4_ = uVar5;
  auVar65._12_4_ = uVar5;
  auVar65._16_4_ = uVar5;
  auVar65._20_4_ = uVar5;
  auVar65._24_4_ = uVar5;
  auVar65._28_4_ = uVar5;
  uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar54._4_4_ = uVar5;
  auVar54._0_4_ = uVar5;
  auVar54._8_4_ = uVar5;
  auVar54._12_4_ = uVar5;
  auVar54._16_4_ = uVar5;
  auVar54._20_4_ = uVar5;
  auVar54._24_4_ = uVar5;
  auVar54._28_4_ = uVar5;
  bVar41 = false;
  auVar22 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar82 = ZEXT3264(auVar22);
  auVar83 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    auVar22._4_4_ = fVar2;
    auVar22._0_4_ = fVar2;
    auVar22._8_4_ = fVar2;
    auVar22._12_4_ = fVar2;
    auVar22._16_4_ = fVar2;
    auVar22._20_4_ = fVar2;
    auVar22._24_4_ = fVar2;
    auVar22._28_4_ = fVar2;
    auVar22 = vsubps_avx(auVar22,auVar60);
    fVar12 = auVar60._0_4_;
    fVar13 = auVar60._4_4_;
    fVar14 = auVar60._8_4_;
    fVar15 = auVar60._12_4_;
    fVar16 = auVar60._16_4_;
    fVar17 = auVar60._20_4_;
    fVar18 = auVar60._24_4_;
    auVar19._4_4_ = fVar3;
    auVar19._0_4_ = fVar3;
    auVar19._8_4_ = fVar3;
    auVar19._12_4_ = fVar3;
    auVar19._16_4_ = fVar3;
    auVar19._20_4_ = fVar3;
    auVar19._24_4_ = fVar3;
    auVar19._28_4_ = fVar3;
    auVar19 = vsubps_avx(auVar19,auVar65);
    auVar20._4_4_ = fVar4;
    auVar20._0_4_ = fVar4;
    auVar20._8_4_ = fVar4;
    auVar20._12_4_ = fVar4;
    auVar20._16_4_ = fVar4;
    auVar20._20_4_ = fVar4;
    auVar20._24_4_ = fVar4;
    auVar20._28_4_ = fVar4;
    auVar20 = vsubps_avx(auVar20,auVar54);
    auVar66._0_4_ = fVar4 + auVar54._0_4_;
    auVar66._4_4_ = fVar4 + auVar54._4_4_;
    auVar66._8_4_ = fVar4 + auVar54._8_4_;
    auVar66._12_4_ = fVar4 + auVar54._12_4_;
    auVar66._16_4_ = fVar4 + auVar54._16_4_;
    auVar66._20_4_ = fVar4 + auVar54._20_4_;
    auVar66._24_4_ = fVar4 + auVar54._24_4_;
    auVar66._28_4_ = fVar4 + auVar54._28_4_;
    auVar80 = auVar81._0_16_;
    do {
      do {
        do {
          if (puVar46 == &local_2378) {
            return bVar41;
          }
          pfVar1 = (float *)(puVar46 + -1);
          puVar46 = puVar46 + -2;
        } while (auVar81._0_4_ < *pfVar1);
        uVar50 = *puVar46;
        do {
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar50 & 8) == 0) {
              puVar43 = (ulong *)((uVar50 & 0xfffffffffffffff0) + 0x40);
              if ((uVar50 & 0xfffffffffffffff0) == 0) {
                puVar43 = (ulong *)0x0;
              }
              uVar5 = (undefined4)puVar43[6];
              auVar61._4_4_ = uVar5;
              auVar61._0_4_ = uVar5;
              auVar61._8_4_ = uVar5;
              auVar61._12_4_ = uVar5;
              auVar61._16_4_ = uVar5;
              auVar61._20_4_ = uVar5;
              auVar61._24_4_ = uVar5;
              auVar61._28_4_ = uVar5;
              uVar5 = *(undefined4 *)((long)puVar43 + 0x3c);
              auVar67._4_4_ = uVar5;
              auVar67._0_4_ = uVar5;
              auVar67._8_4_ = uVar5;
              auVar67._12_4_ = uVar5;
              auVar67._16_4_ = uVar5;
              auVar67._20_4_ = uVar5;
              auVar67._24_4_ = uVar5;
              auVar67._28_4_ = uVar5;
              auVar68._8_8_ = 0;
              auVar68._0_8_ = *puVar43;
              auVar54 = vpmovzxbd_avx2(auVar68);
              auVar54 = vcvtdq2ps_avx(auVar54);
              auVar31 = vfmadd213ps_fma(auVar54,auVar67,auVar61);
              auVar72._8_8_ = 0;
              auVar72._0_8_ = puVar43[1];
              auVar54 = vpmovzxbd_avx2(auVar72);
              auVar54 = vcvtdq2ps_avx(auVar54);
              uVar5 = *(undefined4 *)((long)puVar43 + 0x34);
              auVar74._4_4_ = uVar5;
              auVar74._0_4_ = uVar5;
              auVar74._8_4_ = uVar5;
              auVar74._12_4_ = uVar5;
              auVar74._16_4_ = uVar5;
              auVar74._20_4_ = uVar5;
              auVar74._24_4_ = uVar5;
              auVar74._28_4_ = uVar5;
              auVar32 = vfmadd213ps_fma(auVar54,auVar67,auVar61);
              uVar5 = (undefined4)puVar43[8];
              auVar62._4_4_ = uVar5;
              auVar62._0_4_ = uVar5;
              auVar62._8_4_ = uVar5;
              auVar62._12_4_ = uVar5;
              auVar62._16_4_ = uVar5;
              auVar62._20_4_ = uVar5;
              auVar62._24_4_ = uVar5;
              auVar62._28_4_ = uVar5;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = puVar43[2];
              auVar54 = vpmovzxbd_avx2(auVar7);
              auVar54 = vcvtdq2ps_avx(auVar54);
              auVar33 = vfmadd213ps_fma(auVar54,auVar62,auVar74);
              auVar8._8_8_ = 0;
              auVar8._0_8_ = puVar43[3];
              auVar54 = vpmovzxbd_avx2(auVar8);
              auVar54 = vcvtdq2ps_avx(auVar54);
              uVar5 = (undefined4)puVar43[7];
              auVar79._4_4_ = uVar5;
              auVar79._0_4_ = uVar5;
              auVar79._8_4_ = uVar5;
              auVar79._12_4_ = uVar5;
              auVar79._16_4_ = uVar5;
              auVar79._20_4_ = uVar5;
              auVar79._24_4_ = uVar5;
              auVar79._28_4_ = uVar5;
              auVar34 = vfmadd213ps_fma(auVar54,auVar62,auVar74);
              uVar5 = *(undefined4 *)((long)puVar43 + 0x44);
              auVar63._4_4_ = uVar5;
              auVar63._0_4_ = uVar5;
              auVar63._8_4_ = uVar5;
              auVar63._12_4_ = uVar5;
              auVar63._16_4_ = uVar5;
              auVar63._20_4_ = uVar5;
              auVar63._24_4_ = uVar5;
              auVar63._28_4_ = uVar5;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = puVar43[4];
              auVar54 = vpmovzxbd_avx2(auVar9);
              auVar54 = vcvtdq2ps_avx(auVar54);
              auVar59 = vfmadd213ps_fma(auVar54,auVar63,auVar79);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = puVar43[5];
              auVar54 = vpmovzxbd_avx2(auVar10);
              auVar54 = vcvtdq2ps_avx(auVar54);
              auVar64 = vfmadd213ps_fma(auVar54,auVar63,auVar79);
              auVar37._4_4_ = fVar2;
              auVar37._0_4_ = fVar2;
              auVar37._8_4_ = fVar2;
              auVar37._12_4_ = fVar2;
              auVar37._16_4_ = fVar2;
              auVar37._20_4_ = fVar2;
              auVar37._24_4_ = fVar2;
              auVar37._28_4_ = fVar2;
              auVar54 = vmaxps_avx(auVar37,ZEXT1632(auVar31));
              auVar54 = vminps_avx(auVar54,ZEXT1632(auVar32));
              auVar21 = vsubps_avx(auVar54,auVar37);
              auVar36._4_4_ = fVar3;
              auVar36._0_4_ = fVar3;
              auVar36._8_4_ = fVar3;
              auVar36._12_4_ = fVar3;
              auVar36._16_4_ = fVar3;
              auVar36._20_4_ = fVar3;
              auVar36._24_4_ = fVar3;
              auVar36._28_4_ = fVar3;
              auVar54 = vmaxps_avx(auVar36,ZEXT1632(auVar33));
              auVar54 = vminps_avx(auVar54,ZEXT1632(auVar34));
              auVar51 = vsubps_avx(auVar54,auVar36);
              auVar35._4_4_ = fVar4;
              auVar35._0_4_ = fVar4;
              auVar35._8_4_ = fVar4;
              auVar35._12_4_ = fVar4;
              auVar35._16_4_ = fVar4;
              auVar35._20_4_ = fVar4;
              auVar35._24_4_ = fVar4;
              auVar35._28_4_ = fVar4;
              auVar54 = vmaxps_avx(auVar35,ZEXT1632(auVar59));
              auVar54 = vminps_avx(auVar54,ZEXT1632(auVar64));
              auVar54 = vsubps_avx(auVar54,auVar35);
              auVar76._0_4_ =
                   auVar21._0_4_ * auVar21._0_4_ + auVar51._0_4_ * auVar51._0_4_ +
                   auVar54._0_4_ * auVar54._0_4_;
              auVar76._4_4_ =
                   auVar21._4_4_ * auVar21._4_4_ + auVar51._4_4_ * auVar51._4_4_ +
                   auVar54._4_4_ * auVar54._4_4_;
              auVar76._8_4_ =
                   auVar21._8_4_ * auVar21._8_4_ + auVar51._8_4_ * auVar51._8_4_ +
                   auVar54._8_4_ * auVar54._8_4_;
              auVar76._12_4_ =
                   auVar21._12_4_ * auVar21._12_4_ + auVar51._12_4_ * auVar51._12_4_ +
                   auVar54._12_4_ * auVar54._12_4_;
              auVar76._16_4_ =
                   auVar21._16_4_ * auVar21._16_4_ + auVar51._16_4_ * auVar51._16_4_ +
                   auVar54._16_4_ * auVar54._16_4_;
              auVar76._20_4_ =
                   auVar21._20_4_ * auVar21._20_4_ + auVar51._20_4_ * auVar51._20_4_ +
                   auVar54._20_4_ * auVar54._20_4_;
              auVar76._24_4_ =
                   auVar21._24_4_ * auVar21._24_4_ + auVar51._24_4_ * auVar51._24_4_ +
                   auVar54._24_4_ * auVar54._24_4_;
              auVar76._28_4_ = auVar21._28_4_ + auVar51._28_4_ + auVar51._28_4_;
              in_ZMM7 = ZEXT3264(auVar76);
              uVar23 = vcmpps_avx512vl(ZEXT1632(auVar31),ZEXT1632(auVar32),2);
              uVar29 = vpcmpub_avx512vl(auVar68,auVar72,2);
              auVar38._4_4_ = fVar13 * fVar13;
              auVar38._0_4_ = fVar12 * fVar12;
              auVar38._8_4_ = fVar14 * fVar14;
              auVar38._12_4_ = fVar15 * fVar15;
              auVar38._16_4_ = fVar16 * fVar16;
              auVar38._20_4_ = fVar17 * fVar17;
              auVar38._24_4_ = fVar18 * fVar18;
              auVar38._28_4_ = auVar60._28_4_;
              uVar24 = vcmpps_avx512vl(auVar76,auVar38,2);
              This = (Intersectors *)
                     CONCAT44((int)((ulong)This >> 0x20),
                              (uint)(byte)((byte)uVar23 & (byte)uVar24 & (byte)uVar29));
            }
          }
          else if ((uVar50 & 8) == 0) {
            puVar43 = (ulong *)((uVar50 & 0xfffffffffffffff0) + 0x40);
            if ((uVar50 & 0xfffffffffffffff0) == 0) {
              puVar43 = (ulong *)0x0;
            }
            uVar5 = (undefined4)puVar43[6];
            auVar69._4_4_ = uVar5;
            auVar69._0_4_ = uVar5;
            auVar69._8_4_ = uVar5;
            auVar69._12_4_ = uVar5;
            auVar69._16_4_ = uVar5;
            auVar69._20_4_ = uVar5;
            auVar69._24_4_ = uVar5;
            auVar69._28_4_ = uVar5;
            uVar5 = *(undefined4 *)((long)puVar43 + 0x3c);
            auVar56._4_4_ = uVar5;
            auVar56._0_4_ = uVar5;
            auVar56._8_4_ = uVar5;
            auVar56._12_4_ = uVar5;
            auVar56._16_4_ = uVar5;
            auVar56._20_4_ = uVar5;
            auVar56._24_4_ = uVar5;
            auVar56._28_4_ = uVar5;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = *puVar43;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = puVar43[1];
            uVar30 = vpcmpub_avx512vl(auVar59,auVar64,2);
            auVar54 = vpmovzxbd_avx2(auVar59);
            auVar54 = vcvtdq2ps_avx(auVar54);
            auVar59 = vfmadd213ps_fma(auVar54,auVar56,auVar69);
            auVar54 = vpmovzxbd_avx2(auVar64);
            auVar54 = vcvtdq2ps_avx(auVar54);
            uVar5 = *(undefined4 *)((long)puVar43 + 0x34);
            auVar55._4_4_ = uVar5;
            auVar55._0_4_ = uVar5;
            auVar55._8_4_ = uVar5;
            auVar55._12_4_ = uVar5;
            auVar55._16_4_ = uVar5;
            auVar55._20_4_ = uVar5;
            auVar55._24_4_ = uVar5;
            auVar55._28_4_ = uVar5;
            uVar5 = (undefined4)puVar43[8];
            auVar73._4_4_ = uVar5;
            auVar73._0_4_ = uVar5;
            auVar73._8_4_ = uVar5;
            auVar73._12_4_ = uVar5;
            auVar73._16_4_ = uVar5;
            auVar73._20_4_ = uVar5;
            auVar73._24_4_ = uVar5;
            auVar73._28_4_ = uVar5;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = puVar43[2];
            auVar21 = vpmovzxbd_avx2(auVar31);
            auVar31 = vfmadd213ps_fma(auVar54,auVar56,auVar69);
            auVar54 = vcvtdq2ps_avx(auVar21);
            auVar64 = vfmadd213ps_fma(auVar54,auVar73,auVar55);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = puVar43[3];
            auVar54 = vpmovzxbd_avx2(auVar32);
            auVar54 = vcvtdq2ps_avx(auVar54);
            uVar5 = (undefined4)puVar43[7];
            auVar75._4_4_ = uVar5;
            auVar75._0_4_ = uVar5;
            auVar75._8_4_ = uVar5;
            auVar75._12_4_ = uVar5;
            auVar75._16_4_ = uVar5;
            auVar75._20_4_ = uVar5;
            auVar75._24_4_ = uVar5;
            auVar75._28_4_ = uVar5;
            uVar5 = *(undefined4 *)((long)puVar43 + 0x44);
            auVar78._4_4_ = uVar5;
            auVar78._0_4_ = uVar5;
            auVar78._8_4_ = uVar5;
            auVar78._12_4_ = uVar5;
            auVar78._16_4_ = uVar5;
            auVar78._20_4_ = uVar5;
            auVar78._24_4_ = uVar5;
            auVar78._28_4_ = uVar5;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = puVar43[4];
            auVar21 = vpmovzxbd_avx2(auVar33);
            auVar32 = vfmadd213ps_fma(auVar54,auVar73,auVar55);
            auVar54 = vcvtdq2ps_avx(auVar21);
            auVar33 = vfmadd213ps_fma(auVar54,auVar78,auVar75);
            auVar34._8_8_ = 0;
            auVar34._0_8_ = puVar43[5];
            auVar54 = vpmovzxbd_avx2(auVar34);
            auVar54 = vcvtdq2ps_avx(auVar54);
            auVar34 = vfmadd213ps_fma(auVar54,auVar78,auVar75);
            auVar21._4_4_ = fVar2;
            auVar21._0_4_ = fVar2;
            auVar21._8_4_ = fVar2;
            auVar21._12_4_ = fVar2;
            auVar21._16_4_ = fVar2;
            auVar21._20_4_ = fVar2;
            auVar21._24_4_ = fVar2;
            auVar21._28_4_ = fVar2;
            auVar54 = vmaxps_avx(auVar21,ZEXT1632(auVar59));
            auVar54 = vminps_avx(auVar54,ZEXT1632(auVar31));
            auVar21 = vsubps_avx(auVar54,auVar21);
            auVar51._4_4_ = fVar3;
            auVar51._0_4_ = fVar3;
            auVar51._8_4_ = fVar3;
            auVar51._12_4_ = fVar3;
            auVar51._16_4_ = fVar3;
            auVar51._20_4_ = fVar3;
            auVar51._24_4_ = fVar3;
            auVar51._28_4_ = fVar3;
            auVar54 = vmaxps_avx(auVar51,ZEXT1632(auVar64));
            auVar54 = vminps_avx(auVar54,ZEXT1632(auVar32));
            auVar51 = vsubps_avx(auVar54,auVar51);
            auVar52._4_4_ = fVar4;
            auVar52._0_4_ = fVar4;
            auVar52._8_4_ = fVar4;
            auVar52._12_4_ = fVar4;
            auVar52._16_4_ = fVar4;
            auVar52._20_4_ = fVar4;
            auVar52._24_4_ = fVar4;
            auVar52._28_4_ = fVar4;
            auVar54 = vmaxps_avx(auVar52,ZEXT1632(auVar33));
            auVar54 = vminps_avx(auVar54,ZEXT1632(auVar34));
            auVar54 = vsubps_avx(auVar54,auVar52);
            in_ZMM7 = ZEXT3264(CONCAT428(auVar21._28_4_ + auVar51._28_4_ + auVar51._28_4_,
                                         CONCAT424(auVar21._24_4_ * auVar21._24_4_ +
                                                   auVar51._24_4_ * auVar51._24_4_ +
                                                   auVar54._24_4_ * auVar54._24_4_,
                                                   CONCAT420(auVar21._20_4_ * auVar21._20_4_ +
                                                             auVar51._20_4_ * auVar51._20_4_ +
                                                             auVar54._20_4_ * auVar54._20_4_,
                                                             CONCAT416(auVar21._16_4_ *
                                                                       auVar21._16_4_ +
                                                                       auVar51._16_4_ *
                                                                       auVar51._16_4_ +
                                                                       auVar54._16_4_ *
                                                                       auVar54._16_4_,
                                                                       CONCAT412(auVar21._12_4_ *
                                                                                 auVar21._12_4_ +
                                                                                 auVar51._12_4_ *
                                                                                 auVar51._12_4_ +
                                                                                 auVar54._12_4_ *
                                                                                 auVar54._12_4_,
                                                                                 CONCAT48(auVar21.
                                                  _8_4_ * auVar21._8_4_ +
                                                  auVar51._8_4_ * auVar51._8_4_ +
                                                  auVar54._8_4_ * auVar54._8_4_,
                                                  CONCAT44(auVar21._4_4_ * auVar21._4_4_ +
                                                           auVar51._4_4_ * auVar51._4_4_ +
                                                           auVar54._4_4_ * auVar54._4_4_,
                                                           auVar21._0_4_ * auVar21._0_4_ +
                                                           auVar51._0_4_ * auVar51._0_4_ +
                                                           auVar54._0_4_ * auVar54._0_4_))))))));
            uVar23 = vcmpps_avx512vl(ZEXT1632(auVar31),auVar22,1);
            auVar57._4_4_ = fVar2 + fVar13;
            auVar57._0_4_ = fVar2 + fVar12;
            auVar57._8_4_ = fVar2 + fVar14;
            auVar57._12_4_ = fVar2 + fVar15;
            auVar57._16_4_ = fVar2 + fVar16;
            auVar57._20_4_ = fVar2 + fVar17;
            auVar57._24_4_ = fVar2 + fVar18;
            auVar57._28_4_ = fVar2 + auVar60._28_4_;
            uVar24 = vcmpps_avx512vl(ZEXT1632(auVar59),auVar57,6);
            auVar77._4_4_ = fVar3 + auVar65._4_4_;
            auVar77._0_4_ = fVar3 + auVar65._0_4_;
            auVar77._8_4_ = fVar3 + auVar65._8_4_;
            auVar77._12_4_ = fVar3 + auVar65._12_4_;
            auVar77._16_4_ = fVar3 + auVar65._16_4_;
            auVar77._20_4_ = fVar3 + auVar65._20_4_;
            auVar77._24_4_ = fVar3 + auVar65._24_4_;
            auVar77._28_4_ = fVar3 + auVar65._28_4_;
            uVar29 = vcmpps_avx512vl(ZEXT1632(auVar64),auVar77,6);
            uVar25 = vcmpps_avx512vl(ZEXT1632(auVar32),auVar19,1);
            uVar26 = vcmpps_avx512vl(ZEXT1632(auVar34),auVar20,1);
            uVar27 = vcmpps_avx512vl(ZEXT1632(auVar33),auVar66,6);
            uVar28 = vcmpps_avx512vl(ZEXT1632(auVar59),ZEXT1632(auVar31),2);
            This = (Intersectors *)
                   (ulong)(byte)((byte)uVar30 & (byte)uVar28 &
                                ~((byte)uVar24 | (byte)uVar23 | (byte)uVar29 |
                                  (byte)uVar25 | (byte)uVar27 | (byte)uVar26));
          }
          if ((uVar50 & 8) == 0) {
            if (This == (Intersectors *)0x0) {
              iVar42 = 4;
            }
            else {
              auVar54 = *(undefined1 (*) [32])(uVar50 & 0xfffffffffffffff0);
              auVar21 = ((undefined1 (*) [32])(uVar50 & 0xfffffffffffffff0))[1];
              auVar77 = in_ZMM7._0_32_;
              auVar51 = vpternlogd_avx512vl(auVar82._0_32_,auVar77,auVar83._0_32_,0xf8);
              uVar50 = (ulong)This & 0xffffffff;
              auVar52 = vpcompressd_avx512vl(auVar51);
              bVar39 = (bool)((byte)uVar50 & 1);
              auVar53._0_4_ = (uint)bVar39 * auVar52._0_4_ | (uint)!bVar39 * auVar51._0_4_;
              bVar39 = (bool)((byte)(uVar50 >> 1) & 1);
              auVar53._4_4_ = (uint)bVar39 * auVar52._4_4_ | (uint)!bVar39 * auVar51._4_4_;
              bVar39 = (bool)((byte)(uVar50 >> 2) & 1);
              auVar53._8_4_ = (uint)bVar39 * auVar52._8_4_ | (uint)!bVar39 * auVar51._8_4_;
              bVar39 = (bool)((byte)(uVar50 >> 3) & 1);
              auVar53._12_4_ = (uint)bVar39 * auVar52._12_4_ | (uint)!bVar39 * auVar51._12_4_;
              bVar39 = (bool)((byte)(uVar50 >> 4) & 1);
              auVar53._16_4_ = (uint)bVar39 * auVar52._16_4_ | (uint)!bVar39 * auVar51._16_4_;
              bVar39 = (bool)((byte)(uVar50 >> 5) & 1);
              auVar53._20_4_ = (uint)bVar39 * auVar52._20_4_ | (uint)!bVar39 * auVar51._20_4_;
              bVar39 = (bool)((byte)(uVar50 >> 6) & 1);
              auVar53._24_4_ = (uint)bVar39 * auVar52._24_4_ | (uint)!bVar39 * auVar51._24_4_;
              bVar39 = (bool)((byte)(uVar50 >> 7) & 1);
              auVar53._28_4_ = (uint)bVar39 * auVar52._28_4_ | (uint)!bVar39 * auVar51._28_4_;
              auVar51 = vpermt2q_avx512vl(auVar54,auVar53,auVar21);
              uVar50 = auVar51._0_8_;
              iVar42 = 0;
              uVar44 = (ulong)((long)&This[-1].intersector16_nofilter.name + 7U) & (ulong)This;
              if (uVar44 != 0) {
                auVar51 = vpshufd_avx2(auVar53,0x55);
                vpermt2q_avx512vl(auVar54,auVar51,auVar21);
                auVar52 = vpminsd_avx2(auVar53,auVar51);
                auVar51 = vpmaxsd_avx2(auVar53,auVar51);
                uVar44 = uVar44 - 1 & uVar44;
                if (uVar44 == 0) {
                  auVar52 = vpermi2q_avx512vl(auVar52,auVar54,auVar21);
                  uVar50 = auVar52._0_8_;
                  auVar54 = vpermt2q_avx512vl(auVar54,auVar51,auVar21);
                  *puVar46 = auVar54._0_8_;
                  auVar54 = vpermd_avx2(auVar51,auVar77);
                  *(int *)(puVar46 + 1) = auVar54._0_4_;
                  puVar46 = puVar46 + 2;
                }
                else {
                  auVar69 = vpshufd_avx2(auVar53,0xaa);
                  vpermt2q_avx512vl(auVar54,auVar69,auVar21);
                  auVar57 = vpminsd_avx2(auVar52,auVar69);
                  auVar52 = vpmaxsd_avx2(auVar52,auVar69);
                  auVar69 = vpminsd_avx2(auVar51,auVar52);
                  auVar51 = vpmaxsd_avx2(auVar51,auVar52);
                  uVar44 = uVar44 - 1 & uVar44;
                  if (uVar44 == 0) {
                    auVar52 = vpermi2q_avx512vl(auVar57,auVar54,auVar21);
                    uVar50 = auVar52._0_8_;
                    auVar52 = vpermt2q_avx512vl(auVar54,auVar51,auVar21);
                    *puVar46 = auVar52._0_8_;
                    auVar51 = vpermd_avx2(auVar51,auVar77);
                    *(int *)(puVar46 + 1) = auVar51._0_4_;
                    auVar54 = vpermt2q_avx512vl(auVar54,auVar69,auVar21);
                    puVar46[2] = auVar54._0_8_;
                    auVar54 = vpermd_avx2(auVar69,auVar77);
                    *(int *)(puVar46 + 3) = auVar54._0_4_;
                    puVar46 = puVar46 + 4;
                  }
                  else {
                    auVar52 = vpshufd_avx2(auVar53,0xff);
                    vpermt2q_avx512vl(auVar54,auVar52,auVar21);
                    auVar56 = vpminsd_avx2(auVar57,auVar52);
                    auVar52 = vpmaxsd_avx2(auVar57,auVar52);
                    auVar57 = vpminsd_avx2(auVar69,auVar52);
                    auVar52 = vpmaxsd_avx2(auVar69,auVar52);
                    auVar69 = vpminsd_avx2(auVar51,auVar52);
                    auVar51 = vpmaxsd_avx2(auVar51,auVar52);
                    uVar44 = uVar44 - 1 & uVar44;
                    if (uVar44 == 0) {
                      auVar52 = vpermi2q_avx512vl(auVar56,auVar54,auVar21);
                      uVar50 = auVar52._0_8_;
                      auVar52 = vpermt2q_avx512vl(auVar54,auVar51,auVar21);
                      *puVar46 = auVar52._0_8_;
                      auVar51 = vpermd_avx2(auVar51,auVar77);
                      *(int *)(puVar46 + 1) = auVar51._0_4_;
                      auVar51 = vpermt2q_avx512vl(auVar54,auVar69,auVar21);
                      puVar46[2] = auVar51._0_8_;
                      auVar51 = vpermd_avx2(auVar69,auVar77);
                      *(int *)(puVar46 + 3) = auVar51._0_4_;
                      auVar54 = vpermt2q_avx512vl(auVar54,auVar57,auVar21);
                      puVar46[4] = auVar54._0_8_;
                      auVar54 = vpermd_avx2(auVar57,auVar77);
                      *(int *)(puVar46 + 5) = auVar54._0_4_;
                      puVar46 = puVar46 + 6;
                    }
                    else {
                      auVar55 = valignd_avx512vl(auVar53,auVar53,3);
                      auVar52 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                      auVar56 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar52,auVar56);
                      auVar52 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar57 = vpermt2d_avx512vl(auVar56,auVar52,auVar57);
                      auVar57 = vpermt2d_avx512vl(auVar57,auVar52,auVar69);
                      auVar52 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar51 = vpermt2d_avx512vl(auVar57,auVar52,auVar51);
                      auVar71 = ZEXT3264(auVar51);
                      uVar50 = uVar44;
                      do {
                        auVar52 = auVar71._0_32_;
                        auVar70._8_4_ = 1;
                        auVar70._0_8_ = 0x100000001;
                        auVar70._12_4_ = 1;
                        auVar70._16_4_ = 1;
                        auVar70._20_4_ = 1;
                        auVar70._24_4_ = 1;
                        auVar70._28_4_ = 1;
                        auVar51 = vpermd_avx2(auVar70,auVar55);
                        auVar55 = valignd_avx512vl(auVar55,auVar55,1);
                        vpermt2q_avx512vl(auVar54,auVar55,auVar21);
                        uVar50 = uVar50 - 1 & uVar50;
                        uVar23 = vpcmpd_avx512vl(auVar51,auVar52,5);
                        auVar51 = vpmaxsd_avx2(auVar51,auVar52);
                        bVar40 = (byte)uVar23 << 1;
                        auVar52 = valignd_avx512vl(auVar52,auVar52,7);
                        bVar39 = (bool)((byte)uVar23 & 1);
                        auVar58._4_4_ = (uint)bVar39 * auVar52._4_4_ | (uint)!bVar39 * auVar51._4_4_
                        ;
                        auVar58._0_4_ = auVar51._0_4_;
                        bVar39 = (bool)(bVar40 >> 2 & 1);
                        auVar58._8_4_ = (uint)bVar39 * auVar52._8_4_ | (uint)!bVar39 * auVar51._8_4_
                        ;
                        bVar39 = (bool)(bVar40 >> 3 & 1);
                        auVar58._12_4_ =
                             (uint)bVar39 * auVar52._12_4_ | (uint)!bVar39 * auVar51._12_4_;
                        bVar39 = (bool)(bVar40 >> 4 & 1);
                        auVar58._16_4_ =
                             (uint)bVar39 * auVar52._16_4_ | (uint)!bVar39 * auVar51._16_4_;
                        bVar39 = (bool)(bVar40 >> 5 & 1);
                        auVar58._20_4_ =
                             (uint)bVar39 * auVar52._20_4_ | (uint)!bVar39 * auVar51._20_4_;
                        bVar39 = (bool)(bVar40 >> 6 & 1);
                        auVar58._24_4_ =
                             (uint)bVar39 * auVar52._24_4_ | (uint)!bVar39 * auVar51._24_4_;
                        auVar58._28_4_ =
                             (uint)(bVar40 >> 7) * auVar52._28_4_ |
                             (uint)!(bool)(bVar40 >> 7) * auVar51._28_4_;
                        auVar71 = ZEXT3264(auVar58);
                      } while (uVar50 != 0);
                      lVar45 = POPCOUNT(uVar44) + 3;
                      do {
                        auVar51 = vpermi2q_avx512vl(auVar58,auVar54,auVar21);
                        *puVar46 = auVar51._0_8_;
                        auVar52 = auVar71._0_32_;
                        auVar51 = vpermd_avx2(auVar52,auVar77);
                        *(int *)(puVar46 + 1) = auVar51._0_4_;
                        auVar58 = valignd_avx512vl(auVar52,auVar52,1);
                        puVar46 = puVar46 + 2;
                        auVar71 = ZEXT3264(auVar58);
                        lVar45 = lVar45 + -1;
                      } while (lVar45 != 0);
                      auVar54 = vpermt2q_avx512vl(auVar54,auVar58,auVar21);
                      uVar50 = auVar54._0_8_;
                    }
                    in_ZMM7 = ZEXT3264(auVar77);
                    iVar42 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar42 = 6;
          }
        } while (iVar42 == 0);
      } while ((iVar42 != 6) || (uVar44 = (ulong)((uint)uVar50 & 0xf), uVar44 == 8));
      lVar45 = (uVar50 & 0xfffffffffffffff0) + 0x50;
      lVar49 = 0;
      bVar40 = 0;
      do {
        bVar47 = 0;
        lVar48 = 0;
        do {
          if (*(int *)(lVar45 + lVar48 * 4) == -1) break;
          uVar11 = *(uint *)(lVar45 + -0x10 + lVar48 * 4);
          this = (context->scene->geometries).items[uVar11].ptr;
          context->geomID = uVar11;
          context->primID = *(uint *)(lVar45 + lVar48 * 4);
          bVar39 = Geometry::pointQuery(this,query,context);
          bVar47 = bVar47 | bVar39;
          lVar48 = lVar48 + 1;
        } while (lVar48 != 4);
        bVar40 = bVar40 | bVar47;
        lVar49 = lVar49 + 1;
        lVar45 = lVar45 + 0x60;
      } while (lVar49 != uVar44 - 8);
      auVar81 = ZEXT1664(auVar80);
      auVar54 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar82 = ZEXT3264(auVar54);
      auVar83 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      in_ZMM7 = ZEXT3264(in_ZMM7._0_32_);
    } while (bVar40 == 0);
    uVar5 = *(undefined4 *)&(context->query_radius).field_0;
    auVar60._4_4_ = uVar5;
    auVar60._0_4_ = uVar5;
    auVar60._8_4_ = uVar5;
    auVar60._12_4_ = uVar5;
    auVar60._16_4_ = uVar5;
    auVar60._20_4_ = uVar5;
    auVar60._24_4_ = uVar5;
    auVar60._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar65._4_4_ = uVar5;
    auVar65._0_4_ = uVar5;
    auVar65._8_4_ = uVar5;
    auVar65._12_4_ = uVar5;
    auVar65._16_4_ = uVar5;
    auVar65._20_4_ = uVar5;
    auVar65._24_4_ = uVar5;
    auVar65._28_4_ = uVar5;
    uVar5 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar54._4_4_ = uVar5;
    auVar54._0_4_ = uVar5;
    auVar54._8_4_ = uVar5;
    auVar54._12_4_ = uVar5;
    auVar54._16_4_ = uVar5;
    auVar54._20_4_ = uVar5;
    auVar54._24_4_ = uVar5;
    auVar54._28_4_ = uVar5;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar81 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar6 = (context->query_radius).field_0;
      auVar80 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar81 = ZEXT1664(auVar80);
    }
    bVar41 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }